

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Own<capnp::ClientHook> capnp::newBrokenCap(StringPtr reason)

{
  uint *puVar1;
  BrokenClient *this;
  size_t in_RDX;
  ClientHook *extraout_RDX;
  Disposer *pDVar2;
  Own<capnp::ClientHook> OVar3;
  StringPtr description;
  Own<capnp::(anonymous_namespace)::BrokenClient> local_30;
  
  description.content.ptr = (char *)reason.content.size_;
  pDVar2 = (Disposer *)reason.content.ptr;
  this = (BrokenClient *)operator_new(0x180);
  description.content.size_ = in_RDX;
  anon_unknown_0::BrokenClient::BrokenClient(this,description,false,(void *)0x0);
  puVar1 = &(this->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_30.disposer = &(this->super_Refcounted).super_Disposer;
  pDVar2->_vptr_Disposer = (_func_int **)local_30.disposer;
  pDVar2[1]._vptr_Disposer = (_func_int **)this;
  local_30.ptr = (BrokenClient *)0x0;
  kj::Own<capnp::(anonymous_namespace)::BrokenClient>::~Own(&local_30);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = pDVar2;
  return OVar3;
}

Assistant:

kj::Own<ClientHook> newBrokenCap(kj::StringPtr reason) {
  return kj::refcounted<BrokenClient>(reason, false);
}